

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O3

int pty_compare_by_pid(void *av,void *bv)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*(int *)((long)bv + 0x1078) <= *(int *)((long)av + 0x1078)) {
    uVar1 = (uint)(*(int *)((long)bv + 0x1078) < *(int *)((long)av + 0x1078));
  }
  return uVar1;
}

Assistant:

static int pty_compare_by_pid(void *av, void *bv)
{
    Pty *a = (Pty *)av;
    Pty *b = (Pty *)bv;

    if (a->child_pid < b->child_pid)
        return -1;
    else if (a->child_pid > b->child_pid)
        return +1;
    return 0;
}